

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProfiler.cpp
# Opt level: O1

void __thiscall chrono::utils::ChProfileNode::CleanupMemory(ChProfileNode *this)

{
  ChProfileNode *pCVar1;
  
  pCVar1 = this->Child;
  if (pCVar1 != (ChProfileNode *)0x0) {
    ~ChProfileNode(pCVar1);
    operator_delete(pCVar1,0x38);
  }
  this->Child = (ChProfileNode *)0x0;
  pCVar1 = this->Sibling;
  if (pCVar1 != (ChProfileNode *)0x0) {
    ~ChProfileNode(pCVar1);
    operator_delete(pCVar1,0x38);
  }
  this->Sibling = (ChProfileNode *)0x0;
  return;
}

Assistant:

void	ChProfileNode::CleanupMemory()
{
	delete ( Child);
	Child = NULL;
	delete ( Sibling);
	Sibling = NULL;
}